

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

wchar_t equipped_item_slot(player_body body,object *item)

{
  wchar_t local_1c;
  wchar_t i;
  object *item_local;
  
  if (item == (object *)0x0) {
    item_local._4_4_ = (wchar_t)body.count;
  }
  else {
    local_1c = L'\0';
    while ((local_1c < (int)(uint)body.count && (item != body.slots[local_1c].obj))) {
      local_1c = local_1c + L'\x01';
    }
    item_local._4_4_ = local_1c;
  }
  return item_local._4_4_;
}

Assistant:

int equipped_item_slot(struct player_body body, struct object *item)
{
	int i;

	if (item == NULL) return body.count;

	/* Look for an equipment slot with this item */
	for (i = 0; i < body.count; i++)
		if (item == body.slots[i].obj) break;

	/* Correct slot, or body.count if not equipped */
	return i;
}